

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidTopology(ON_Brep *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ON_BrepVertex *pOVar11;
  ON_BrepEdge *pOVar12;
  ON_Curve *pOVar13;
  ON_BrepTrim *pOVar14;
  ON_BrepLoop *pOVar15;
  ON_BrepFace *pOVar16;
  ON_Surface *pOVar17;
  ON_BrepLoop *loop_1;
  ON_BrepTrim *trim_1;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *trim;
  ON_BrepEdge *edge;
  ON_BrepVertex *vertex;
  uint local_50;
  int li;
  int ti;
  int fi;
  int ei;
  int vi;
  int face_count;
  int loop_count;
  int trim_count;
  int edge_count;
  int vertex_count;
  int surface_count;
  int curve3d_count;
  int curve2d_count;
  ON_TextLog *text_log_local;
  ON_Brep *this_local;
  
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  iVar3 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  iVar4 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  iVar5 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
  iVar6 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  iVar7 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar8 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  iVar9 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  if (((iVar9 == 0) && (iVar6 == 0)) && (iVar5 == 0)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_Brep has no faces, edges, or vertices\n");
    }
    return false;
  }
  if (iVar9 != 0) {
    if (iVar6 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no edges.\n");
      }
      return false;
    }
    if (iVar8 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no loops.\n");
      }
      return false;
    }
    if (iVar4 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no surfaces.\n");
      }
      return false;
    }
    if (iVar7 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no trims.\n");
      }
      return false;
    }
    if (iVar2 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no 2d curves.\n");
      }
      return false;
    }
  }
  if (iVar6 != 0) {
    if (iVar3 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no 3d curves.\n");
      }
      return false;
    }
    if (iVar5 == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep has no vertices.\n");
      }
      return false;
    }
  }
  for (fi = 0; fi < iVar5; fi = fi + 1) {
    pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                        ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
    if (pOVar11->m_vertex_index == -1) {
      pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
      iVar2 = ON_SimpleArray<int>::Count(&pOVar11->m_ei);
      if (0 < iVar2) {
        if (text_log != (ON_TextLog *)0x0) {
          uVar10 = ON_SimpleArray<int>::Count(&pOVar11->m_ei);
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_V[%d] is deleted (m_vertex_index = -1) but vertex.m_ei.Count() = %d.\n"
                            ,(ulong)(uint)fi,(ulong)uVar10);
        }
        return false;
      }
    }
    else {
      pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
      if (pOVar11->m_vertex_index != fi) {
        if (text_log != (ON_TextLog *)0x0) {
          pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                              ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
          ON_TextLog::Print(text_log,"ON_Brep.m_V[%d].m_vertex_index = %d (should be %d)\n",
                            (ulong)(uint)fi,(ulong)(uint)pOVar11->m_vertex_index,(ulong)(uint)fi);
        }
        return false;
      }
    }
  }
  for (ti = 0; ti < iVar6; ti = ti + 1) {
    pOVar12 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
    if (pOVar12->m_edge_index == -1) {
      pOVar12 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
      iVar2 = ON_SimpleArray<int>::Count(&pOVar12->m_ti);
      if (0 < iVar2) {
        if (text_log != (ON_TextLog *)0x0) {
          uVar10 = ON_SimpleArray<int>::Count(&pOVar12->m_ti);
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_ei.Count() = %d.\n"
                            ,(ulong)(uint)ti,(ulong)uVar10);
        }
        return false;
      }
      if (pOVar12->m_c3i != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_c3i=%d (should be -1).\n"
                            ,(ulong)(uint)ti,(ulong)(uint)pOVar12->m_c3i);
        }
        return false;
      }
      pOVar13 = ON_CurveProxy::ProxyCurve(&pOVar12->super_ON_CurveProxy);
      if (pOVar13 != (ON_Curve *)0x0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_curve is not nullptr.\n"
                            ,(ulong)(uint)ti);
        }
        return false;
      }
      if (pOVar12->m_vi[0] != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[0]=%d (should be -1).\n"
                            ,(ulong)(uint)ti,(ulong)(uint)pOVar12->m_vi[0]);
        }
        return false;
      }
      if (pOVar12->m_vi[1] != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[1]=%d (should be -1).\n"
                            ,(ulong)(uint)ti,(ulong)(uint)pOVar12->m_vi[1]);
        }
        return false;
      }
    }
    else {
      pOVar12 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
      if (pOVar12->m_edge_index != ti) {
        if (text_log != (ON_TextLog *)0x0) {
          pOVar12 = ON_ClassArray<ON_BrepEdge>::operator[]
                              ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
          ON_TextLog::Print(text_log,"ON_Brep.m_E[%d].m_edge_index = %d (should be %d)\n",
                            (ulong)(uint)ti,(ulong)(uint)pOVar12->m_edge_index,(ulong)(uint)ti);
        }
        return false;
      }
    }
  }
  local_50 = 0;
  do {
    if (iVar7 <= (int)local_50) {
      for (vertex._4_4_ = 0; (int)vertex._4_4_ < iVar8; vertex._4_4_ = vertex._4_4_ + 1) {
        pOVar15 = ON_ClassArray<ON_BrepLoop>::operator[]
                            ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,vertex._4_4_);
        if (pOVar15->m_loop_index == -1) {
          pOVar15 = ON_ClassArray<ON_BrepLoop>::operator[]
                              ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,vertex._4_4_);
          if (pOVar15->m_fi != -1) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_fi=%d (should be -1).\n"
                                ,(ulong)vertex._4_4_,(ulong)(uint)pOVar15->m_fi);
            }
            return false;
          }
          iVar2 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
          if (0 < iVar2) {
            if (text_log != (ON_TextLog *)0x0) {
              uVar10 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
              ON_TextLog::Print(text_log,
                                "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_ti.Count()=%d.\n"
                                ,(ulong)vertex._4_4_,(ulong)uVar10);
            }
            return false;
          }
        }
        else {
          pOVar15 = ON_ClassArray<ON_BrepLoop>::operator[]
                              ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,vertex._4_4_);
          if (pOVar15->m_loop_index != vertex._4_4_) {
            if (text_log != (ON_TextLog *)0x0) {
              pOVar15 = ON_ClassArray<ON_BrepLoop>::operator[]
                                  ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,vertex._4_4_);
              ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_loop_index = %d (should be %d)\n",
                                (ulong)vertex._4_4_,(ulong)(uint)pOVar15->m_loop_index,
                                (ulong)vertex._4_4_);
            }
            return false;
          }
        }
      }
      li = 0;
      do {
        if (iVar9 <= li) {
          fi = 0;
          while( true ) {
            if (iVar5 <= fi) {
              ti = 0;
              while( true ) {
                if (iVar6 <= ti) {
                  li = 0;
                  while( true ) {
                    if (iVar9 <= li) {
                      local_50 = 0;
                      while( true ) {
                        if (iVar7 <= (int)local_50) {
                          vertex._4_4_ = 0;
                          while( true ) {
                            if (iVar8 <= (int)vertex._4_4_) {
                              return true;
                            }
                            pOVar15 = ON_ClassArray<ON_BrepLoop>::operator[]
                                                ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                                 vertex._4_4_);
                            if ((pOVar15->m_loop_index != -1) &&
                               (bVar1 = IsValidLoopTopology(this,vertex._4_4_,text_log), !bVar1))
                            break;
                            vertex._4_4_ = vertex._4_4_ + 1;
                          }
                          if (text_log != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(text_log,"ON_Brep.m_L[%d] is invalid.\n",
                                              (ulong)vertex._4_4_);
                          }
                          return false;
                        }
                        pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                                            ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
                        if ((pOVar14->m_trim_index != -1) &&
                           (bVar1 = IsValidTrimTopology(this,local_50,text_log), !bVar1)) break;
                        local_50 = local_50 + 1;
                      }
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,"ON_Brep.m_T[%d] is invalid.\n",(ulong)local_50);
                      }
                      return false;
                    }
                    pOVar16 = ON_ClassArray<ON_BrepFace>::operator[]
                                        ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
                    if ((pOVar16->m_face_index != -1) &&
                       (bVar1 = IsValidFaceTopology(this,li,text_log), !bVar1)) break;
                    li = li + 1;
                  }
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_Brep.m_F[%d] is invalid.\n",(ulong)(uint)li);
                  }
                  return false;
                }
                pOVar12 = ON_ClassArray<ON_BrepEdge>::operator[]
                                    ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
                if ((pOVar12->m_edge_index != -1) &&
                   (bVar1 = IsValidEdgeTopology(this,ti,text_log), !bVar1)) break;
                ti = ti + 1;
              }
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"ON_Brep.m_E[%d] is invalid.\n",(ulong)(uint)ti);
              }
              return false;
            }
            pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                                ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
            if ((pOVar11->m_vertex_index != -1) &&
               (bVar1 = IsValidVertexTopology(this,fi,text_log), !bVar1)) break;
            fi = fi + 1;
          }
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_Brep.m_V[%d] is invalid.\n",(ulong)(uint)fi);
          }
          return false;
        }
        pOVar16 = ON_ClassArray<ON_BrepFace>::operator[]
                            ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
        if (pOVar16->m_face_index == -1) {
          pOVar16 = ON_ClassArray<ON_BrepFace>::operator[]
                              ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
          if (pOVar16->m_si != -1) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_si=%d (should be -1).\n"
                                ,(ulong)(uint)li,(ulong)(uint)pOVar16->m_si);
            }
            return false;
          }
          pOVar17 = ON_SurfaceProxy::ProxySurface(&pOVar16->super_ON_SurfaceProxy);
          if (pOVar17 != (ON_Surface *)0x0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.ProxySurface() is not nullptr.\n"
                                ,(ulong)(uint)li);
            }
            return false;
          }
          iVar2 = ON_SimpleArray<int>::Count(&pOVar16->m_li);
          if (0 < iVar2) {
            if (text_log != (ON_TextLog *)0x0) {
              uVar10 = ON_SimpleArray<int>::Count(&pOVar16->m_li);
              ON_TextLog::Print(text_log,
                                "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_li.Count()=%d.\n"
                                ,(ulong)(uint)li,(ulong)uVar10);
            }
            return false;
          }
        }
        else {
          pOVar16 = ON_ClassArray<ON_BrepFace>::operator[]
                              ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
          if (pOVar16->m_face_index != li) {
            if (text_log != (ON_TextLog *)0x0) {
              pOVar16 = ON_ClassArray<ON_BrepFace>::operator[]
                                  ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
              ON_TextLog::Print(text_log,"ON_Brep.m_F[%d].m_face_index = %d (should be %d)\n",
                                (ulong)(uint)li,(ulong)(uint)pOVar16->m_face_index,(ulong)(uint)li);
            }
            return false;
          }
        }
        li = li + 1;
      } while( true );
    }
    pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                        ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
    if (pOVar14->m_trim_index == -1) {
      pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
      if (pOVar14->m_ei != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_ei=%d (should be -1).\n"
                            ,(ulong)local_50,(ulong)(uint)pOVar14->m_ei);
        }
        return false;
      }
      if (pOVar14->m_li != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_li=%d (should be -1).\n"
                            ,(ulong)local_50,(ulong)(uint)pOVar14->m_li);
        }
        return false;
      }
      if (pOVar14->m_c2i != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_c2i=%d (should be -1).\n"
                            ,(ulong)local_50,(ulong)(uint)pOVar14->m_c2i);
        }
        return false;
      }
      if (pOVar14->m_vi[0] != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[0]=%d (should be -1).\n"
                            ,(ulong)local_50,(ulong)(uint)pOVar14->m_vi[0]);
        }
        return false;
      }
      if (pOVar14->m_vi[1] != -1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[1]=%d (should be -1).\n"
                            ,(ulong)local_50,(ulong)(uint)pOVar14->m_vi[1]);
        }
        return false;
      }
    }
    else {
      pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
      if (pOVar14->m_trim_index != local_50) {
        if (text_log != (ON_TextLog *)0x0) {
          pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                              ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
          ON_TextLog::Print(text_log,"ON_Brep.m_T[%d].m_trim_index = %d (should be %d)\n",
                            (ulong)local_50,(ulong)(uint)pOVar14->m_trim_index,(ulong)local_50);
        }
        return false;
      }
      pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_50);
      uVar10 = (*(pOVar14->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                 _vptr_ON_Object[6])(pOVar14,text_log);
      if ((uVar10 & 1) == 0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_T[%d] is not valid\n",(ulong)local_50);
        }
        return false;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool
ON_Brep::IsValidTopology( ON_TextLog* text_log ) const
{
  const int curve2d_count = m_C2.Count();
  const int curve3d_count = m_C3.Count();
  const int surface_count = m_S.Count();
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int vi, ei, fi, ti, li;

  if ( 0 == face_count && 0 == edge_count && 0 == vertex_count )
  {
    if ( text_log )
      text_log->Print( "ON_Brep has no faces, edges, or vertices\n");
    return false;
  }

  if ( 0 != face_count )
  {
    if ( 0 == edge_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no edges.\n");
      return false;
    }
    if ( 0 == loop_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no loops.\n");
      return false;
    }
    if ( 0 == surface_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no surfaces.\n");
      return false;
    }
    if ( 0 == trim_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no trims.\n");
      return false;
    }
    if ( 0 == curve2d_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no 2d curves.\n");
      return false;
    }
  }

  if ( 0 != edge_count )
  {
    if ( 0 == curve3d_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no 3d curves.\n");
      return false;
    }
    if ( 0 == vertex_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no vertices.\n");
      return false;
    }
  }

  // check element indices match array positions
  for ( vi = 0; vi < vertex_count; vi++ ) 
  {
    if ( m_V[vi].m_vertex_index == -1 )
    {
      const ON_BrepVertex& vertex = m_V[vi];
      if ( vertex.m_ei.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_V[%d] is deleted (m_vertex_index = -1) but vertex.m_ei.Count() = %d.\n",
                           vi, vertex.m_ei.Count() );
        return false;
      }
    }
    else if ( m_V[vi].m_vertex_index != vi )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_V[%d].m_vertex_index = %d (should be %d)\n",
                         vi, m_V[vi].m_vertex_index, vi );
      return false;
    }
  }

  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
    {
      const ON_BrepEdge& edge = m_E[ei];
      if ( edge.m_ti.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_ei.Count() = %d.\n",
                           ei, edge.m_ti.Count() );
        return false;
      }
      if ( edge.m_c3i != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_c3i=%d (should be -1).\n",
                           ei, edge.m_c3i );
        return false;
      }
      if ( edge.ProxyCurve() )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_curve is not nullptr.\n",
                           ei );
        return false;
      }
      if ( edge.m_vi[0] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[0]=%d (should be -1).\n",
                           ei, edge.m_vi[0] );
        return false;
      }
      if ( edge.m_vi[1] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[1]=%d (should be -1).\n",
                           ei, edge.m_vi[1] );
        return false;
      }
    }
    else if ( m_E[ei].m_edge_index != ei )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_E[%d].m_edge_index = %d (should be %d)\n",
                         ei, m_E[ei].m_edge_index, ei );
      return false;
    }
  }

  for ( ti = 0; ti < trim_count; ti++ ) 
  {
    if ( m_T[ti].m_trim_index == -1 )
    {
      const ON_BrepTrim& trim = m_T[ti];
      if ( trim.m_ei != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_ei=%d (should be -1).\n",
                           ti, trim.m_ei );
        return false;
      }
      if ( trim.m_li != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_li=%d (should be -1).\n",
                           ti, trim.m_li );
        return false;
      }
      if ( trim.m_c2i != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_c2i=%d (should be -1).\n",
                           ti, trim.m_c2i );
        return false;
      }
      if ( trim.m_vi[0] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[0]=%d (should be -1).\n",
                           ti, trim.m_vi[0] );
        return false;
      }
      if ( trim.m_vi[1] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[1]=%d (should be -1).\n",
                           ti, trim.m_vi[1] );
        return false;
      }
    }
    else if ( m_T[ti].m_trim_index != ti  )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_T[%d].m_trim_index = %d (should be %d)\n",
                         ti, m_T[ti].m_trim_index, ti );
      return false;
    }
    else if ( !m_T[ti].IsValid( text_log ) )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_T[%d] is not valid\n",ti );
      return false;
    }
  }

  for ( li = 0; li < loop_count; li++ ) 
  {
    if ( m_L[li].m_loop_index == -1 )
    {
      const ON_BrepLoop& loop = m_L[li];
      if ( loop.m_fi != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_fi=%d (should be -1).\n",
                           li, loop.m_fi );
        return false;
      }
      if ( loop.m_ti.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_ti.Count()=%d.\n",
                           li, loop.m_ti.Count() );
        return false;
      }
    }
    else if ( m_L[li].m_loop_index != li )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_L[%d].m_loop_index = %d (should be %d)\n",
                         li, m_L[li].m_loop_index, li );
      return false;
    }
  }

  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
    {
      const ON_BrepFace& face = m_F[fi];
      if ( face.m_si != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_si=%d (should be -1).\n",
                           fi, face.m_si );
        return false;
      }
      if ( face.ProxySurface() )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.ProxySurface() is not nullptr.\n",
                           fi );
        return false;
      }
      if ( face.m_li.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_li.Count()=%d.\n",
                           fi, face.m_li.Count() );
        return false;
      }
    }
    else if ( m_F[fi].m_face_index != fi )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_F[%d].m_face_index = %d (should be %d)\n",
                         fi, m_F[fi].m_face_index, fi );
      return false;
    }
  }

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexTopology( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeTopology( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceTopology( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_trim_index == -1 )
      continue;
    if ( !IsValidTrimTopology( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    const ON_BrepLoop& loop = m_L[li];
    if ( loop.m_loop_index == -1 )
      continue;
    if ( !IsValidLoopTopology( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}